

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

vm_strbuf_ext *
vm_strbuf_ext::expand_ext(CVmObjStringBuffer *self,vm_strbuf_ext *old_ext,int32_t new_len)

{
  CVmVarHeap *pCVar1;
  int in_EDX;
  vm_strbuf_ext *in_RSI;
  CVmObjStringBuffer *in_RDI;
  vm_strbuf_ext *new_ext;
  int32_t new_alo;
  vm_strbuf_ext *local_8;
  
  local_8 = in_RSI;
  if (in_RSI->alo < in_EDX) {
    local_8 = alloc_ext(in_RDI,(int32_t)((ulong)in_RSI >> 0x20),(int32_t)in_RSI);
    local_8->len = in_RSI->len;
    memcpy(local_8->buf,in_RSI->buf,(long)in_RSI->len << 2);
    pCVar1 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar1->_vptr_CVmVarHeap[6])(pCVar1,in_RSI);
  }
  return local_8;
}

Assistant:

vm_strbuf_ext *vm_strbuf_ext::expand_ext(VMG_ CVmObjStringBuffer *self,
                                         vm_strbuf_ext *old_ext,
                                         int32_t new_len)
{
    /* if the buffer is big enough to hold the new length, we're done */
    if (old_ext->alo >= new_len)
        return old_ext;

    /* 
     *   figure the required new allocation size: we allocate in increments
     *   of 'inc' from the old extension, so allocate enough for the new
     *   length, rounded up 
     */
    int32_t new_alo = ((new_len + old_ext->inc - 1) / old_ext->inc)
                      * old_ext->inc;
    vm_strbuf_ext *new_ext = alloc_ext(vmg_ self, new_alo, old_ext->inc);

    /* copy the current string buffer to the new extension */
    new_ext->len = old_ext->len;
    memcpy(new_ext->buf, old_ext->buf,
           old_ext->len * sizeof(old_ext->buf[0]));

    /* delete the old memory */
    G_mem->get_var_heap()->free_mem(old_ext);

    /* return the new extension */
    return new_ext;
}